

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

int add_pattr(attr_list list,atom_t attr_id,attr_value_type val_type,attr_union value)

{
  uchar *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  int iVar5;
  int_attr_struct *__ptr;
  bool bVar6;
  undefined8 uVar7;
  attr_list *pp_Var8;
  attr_p paVar9;
  ulong uVar10;
  long lVar11;
  
  if (val_type == Attr_Int4) {
    __ptr = (list->l).list.iattrs;
    bVar4 = __ptr->int_attr_count;
    uVar10 = (ulong)bVar4;
    if (bVar4 != 0) {
      pp_Var8 = (attr_list *)realloc(__ptr,uVar10 * 8 + 0x1c);
      (list->l).lists.lists = pp_Var8;
      lVar11 = (ulong)bVar4 + 1;
      do {
        pp_Var8 = (list->l).lists.lists;
        iVar5 = *(int *)((long)pp_Var8 + lVar11 * 8 + -0xc);
        if (iVar5 <= attr_id) {
          uVar10 = (ulong)((int)lVar11 - 1);
          goto LAB_0010491e;
        }
        *(int *)((long)pp_Var8 + lVar11 * 8 + -4) = iVar5;
        pp_Var8 = (list->l).lists.lists;
        *(undefined4 *)(pp_Var8 + lVar11) = *(undefined4 *)(pp_Var8 + lVar11 + -1);
        lVar11 = lVar11 + -1;
      } while (1 < lVar11);
      uVar10 = 0;
    }
LAB_0010491e:
    ((list->l).list.iattrs)->iattr[uVar10].attr_id = attr_id;
    ((list->l).list.iattrs)->iattr[uVar10].value = (int4)value.u.f;
    puVar1 = &((list->l).list.iattrs)->int_attr_count;
    *puVar1 = *puVar1 + '\x01';
  }
  else {
    bVar4 = ((list->l).list.iattrs)->other_attr_count;
    uVar10 = (ulong)bVar4;
    if (bVar4 == 0) {
      paVar9 = (attr_p)malloc(0x18);
    }
    else {
      paVar9 = (attr_p)realloc((list->l).list.attributes,uVar10 * 0x18 + 0x18);
    }
    (list->l).list.attributes = paVar9;
    if (uVar10 != 0) {
      lVar11 = (ulong)bVar4 * 0x18;
      do {
        paVar9 = (list->l).list.attributes;
        iVar5 = *(int *)((long)&paVar9[-1].attr_id + lVar11);
        if (iVar5 <= attr_id) {
          uVar10 = uVar10 & 0xffffffff;
          goto LAB_0010493e;
        }
        *(int *)((long)&paVar9->attr_id + lVar11) = iVar5;
        paVar9 = (list->l).list.attributes;
        *(undefined4 *)((long)&paVar9->val_type + lVar11) =
             *(undefined4 *)((long)paVar9 + lVar11 + -0x14);
        paVar9 = (list->l).list.attributes;
        puVar2 = (undefined8 *)((long)paVar9 + lVar11 + -0x10);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)&(paVar9->value).u + lVar11);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        lVar11 = lVar11 + -0x18;
        bVar6 = 1 < (long)uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar6);
      uVar10 = 0;
    }
LAB_0010493e:
    (list->l).list.attributes[uVar10].attr_id = attr_id;
    (list->l).list.attributes[uVar10].val_type = val_type;
    paVar9 = (list->l).list.attributes;
    paVar9[uVar10].value.u.l = (ssize_t)value.u.d;
    paVar9[uVar10].value.u.o.buffer = value.u._8_8_;
    puVar1 = &((list->l).list.iattrs)->other_attr_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return 1;
}

Assistant:

extern int
add_pattr(attr_list list, atom_t attr_id, attr_value_type val_type, attr_union value)
{
    int i;
    if (val_type == Attr_Int4) {
	int count = list->l.list.iattrs->int_attr_count;
	if (count > 0) {
	    int size = sizeof(struct int_attr_struct) + 
		(count+2)* sizeof(int_attr);
	    list->l.list.iattrs = realloc(list->l.list.iattrs, size);
	}
	
	for (i = count - 1; i >= 0; i--) {
	    if (list->l.list.iattrs->iattr[i].attr_id > attr_id) {
		list->l.list.iattrs->iattr[i+1].attr_id = list->l.list.iattrs->iattr[i].attr_id;
		list->l.list.iattrs->iattr[i+1].value = list->l.list.iattrs->iattr[i].value;
	    } else {
		break;
	    }
	}
	
	list->l.list.iattrs->iattr[i+1].attr_id = attr_id;
	list->l.list.iattrs->iattr[i+1].value = (int4) (long) value.u.i;
	list->l.list.iattrs->int_attr_count++;
    } else {
	int count = list->l.list.iattrs->other_attr_count;
	if (count == 0) {
	    list->l.list.attributes = (attr_p) malloc(sizeof(attr));
	} else {	    
	    list->l.list.attributes = (attr_p) realloc(list->l.list.attributes,
						       sizeof(attr)*(count+1));
	}
	
	for (i = count - 1; i >= 0; i--) {
	    if (list->l.list.attributes[i].attr_id > attr_id) {
		list->l.list.attributes[i+1].attr_id = list->l.list.attributes[i].attr_id;
		list->l.list.attributes[i+1].val_type = list->l.list.attributes[i].val_type;
		list->l.list.attributes[i+1].value = list->l.list.attributes[i].value;
	    } else {
		break;
	    }
	}
	
	list->l.list.attributes[i+1].attr_id = attr_id;
	list->l.list.attributes[i+1].val_type = val_type;
	list->l.list.attributes[i+1].value = value;
	list->l.list.iattrs->other_attr_count++;
    }
    return 1;
}